

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t al_fwrite32le(ALLEGRO_FILE *f,int32_t l)

{
  byte bVar1;
  uint uVar2;
  undefined4 in_ESI;
  uint8_t b4;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined8 local_8;
  
  bVar5 = (byte)((uint)in_ESI >> 0x18);
  bVar4 = (byte)((uint)in_ESI >> 0x10);
  bVar3 = (byte)((uint)in_ESI >> 8);
  bVar1 = (byte)in_ESI;
  uVar2 = al_fputc((ALLEGRO_FILE *)CONCAT44(in_ESI,in_ESI),0);
  if (uVar2 == bVar1) {
    uVar2 = al_fputc((ALLEGRO_FILE *)
                     CONCAT44(in_ESI,CONCAT13(bVar5,CONCAT12(bVar4,CONCAT11(bVar3,bVar1)))),0);
    if (uVar2 == bVar3) {
      uVar2 = al_fputc((ALLEGRO_FILE *)
                       CONCAT44(in_ESI,CONCAT13(bVar5,CONCAT12(bVar4,CONCAT11(bVar3,bVar1)))),0);
      if (uVar2 == bVar4) {
        uVar2 = al_fputc((ALLEGRO_FILE *)
                         CONCAT44(in_ESI,CONCAT13(bVar5,CONCAT12(bVar4,CONCAT11(bVar3,bVar1)))),0);
        if (uVar2 == bVar5) {
          local_8 = 4;
        }
        else {
          local_8 = 3;
        }
      }
      else {
        local_8 = 2;
      }
    }
    else {
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t al_fwrite32le(ALLEGRO_FILE *f, int32_t l)
{
   uint8_t b1, b2, b3, b4;
   ASSERT(f);

   b1 = ((l & 0xFF000000L) >> 24);
   b2 = ((l & 0x00FF0000L) >> 16);
   b3 = ((l & 0x0000FF00L) >> 8);
   b4 = l & 0x00FF;

   if (al_fputc(f, b4) == b4) {
      if (al_fputc(f, b3) == b3) {
         if (al_fputc(f, b2) == b2) {
            if (al_fputc(f, b1) == b1) {
               return 4;
            }
            return 3;
         }
         return 2;
      }
      return 1;
   }
   return 0;
}